

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O1

PHYSFS_File * doOpenWrite(char *_fname,int appending)

{
  void *pvVar1;
  _func_PHYSFS_Io_ptr_void_ptr_char_ptr *p_Var2;
  _func_void_PHYSFS_Io_ptr *p_Var3;
  DirHandle *pDVar4;
  int iVar5;
  size_t sVar6;
  ulong *puVar7;
  PHYSFS_Io *pPVar8;
  FileHandle *pFVar9;
  ulong *puVar10;
  PHYSFS_ErrorCode PVar11;
  bool bVar12;
  ulong uStack_38;
  ulong *local_30;
  char *fname;
  
  puVar10 = &uStack_38;
  if (_fname == (char *)0x0) {
    PVar11 = PHYSFS_ERR_INVALID_ARGUMENT;
LAB_001094b4:
    *(undefined8 *)((long)puVar10 + -8) = 0x1094b9;
    PHYSFS_setErrorCode(PVar11);
    return (PHYSFS_File *)0x0;
  }
  sVar6 = strlen(_fname);
  if (sVar6 + 1 < 0x100) {
    puVar7 = (ulong *)((long)&uStack_38 - (sVar6 + 0x18 & 0xfffffffffffffff0));
    puVar10 = puVar7;
  }
  else {
    puVar7 = (ulong *)0x0;
    puVar10 = &uStack_38;
  }
  bVar12 = puVar7 == (ulong *)0x0;
  if (bVar12) {
    puVar10[-1] = 0x1093e5;
    puVar7 = (ulong *)(*__PHYSFS_AllocatorHooks.Malloc)(sVar6 + 9);
  }
  if (puVar7 == (ulong *)0x0) {
    puVar7 = (ulong *)0x0;
  }
  else {
    *puVar7 = (ulong)bVar12;
    puVar7 = puVar7 + 1;
  }
  if (puVar7 == (ulong *)0x0) {
    PVar11 = PHYSFS_ERR_OUT_OF_MEMORY;
    local_30 = (ulong *)0x0;
    goto LAB_001094b4;
  }
  local_30 = puVar7;
  puVar10[-1] = 0x109410;
  iVar5 = sanitizePlatformIndependentPath(_fname,(char *)puVar7);
  if (iVar5 == 0) {
    pFVar9 = (FileHandle *)0x0;
    goto LAB_001094dc;
  }
  puVar10[-1] = 0x109424;
  __PHYSFS_platformGrabMutex(stateLock);
  pDVar4 = writeDir;
  if (writeDir == (DirHandle *)0x0) {
    PVar11 = PHYSFS_ERR_NO_WRITE_DIR;
LAB_001094c8:
    puVar10[-1] = 0x1094cd;
    PHYSFS_setErrorCode(PVar11);
LAB_001094cd:
    pFVar9 = (FileHandle *)0x0;
  }
  else {
    pFVar9 = (FileHandle *)0x0;
    puVar10[-1] = 0x109445;
    iVar5 = verifyPath(writeDir,(char **)&local_30,0);
    puVar7 = local_30;
    if (iVar5 != 0) {
      pvVar1 = pDVar4->opaque;
      p_Var2 = (&pDVar4->funcs->openWrite)[appending != 0];
      puVar10[-1] = 0x109463;
      pPVar8 = (*p_Var2)(pvVar1,(char *)puVar7);
      if (pPVar8 == (PHYSFS_Io *)0x0) goto LAB_001094cd;
      puVar10[-1] = 0x109476;
      pFVar9 = (FileHandle *)(*__PHYSFS_AllocatorHooks.Malloc)(0x40);
      if (pFVar9 == (FileHandle *)0x0) {
        p_Var3 = pPVar8->destroy;
        puVar10[-1] = 0x10950c;
        (*p_Var3)(pPVar8);
        PVar11 = PHYSFS_ERR_OUT_OF_MEMORY;
        goto LAB_001094c8;
      }
      pFVar9->io = (PHYSFS_Io *)0x0;
      *(undefined8 *)&pFVar9->forReading = 0;
      pFVar9->dirHandle = (DirHandle *)0x0;
      pFVar9->buffer = (PHYSFS_uint8 *)0x0;
      pFVar9->bufpos = 0;
      pFVar9->next = (__PHYSFS_FILEHANDLE__ *)0x0;
      pFVar9->bufsize = 0;
      pFVar9->buffill = 0;
      pFVar9->io = pPVar8;
      pFVar9->dirHandle = pDVar4;
      pFVar9->next = openWriteList;
      openWriteList = pFVar9;
    }
  }
  puVar10[-1] = 0x1094dc;
  __PHYSFS_platformReleaseMutex(stateLock);
LAB_001094dc:
  if (local_30 == (ulong *)0x0) {
    return (PHYSFS_File *)pFVar9;
  }
  if (local_30[-1] == 0) {
    return (PHYSFS_File *)pFVar9;
  }
  puVar7 = local_30 + -1;
  puVar10[-1] = 0x1094f6;
  (*__PHYSFS_AllocatorHooks.Free)(puVar7);
  return (PHYSFS_File *)pFVar9;
}

Assistant:

static PHYSFS_File *doOpenWrite(const char *_fname, int appending)
{
    FileHandle *fh = NULL;
    size_t len;
    char *fname;

    BAIL_IF(!_fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    len = strlen(_fname) + 1;
    fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF(!fname, PHYSFS_ERR_OUT_OF_MEMORY, 0);

    if (sanitizePlatformIndependentPath(_fname, fname))
    {
        PHYSFS_Io *io = NULL;
        DirHandle *h = NULL;
        const PHYSFS_Archiver *f;

        __PHYSFS_platformGrabMutex(stateLock);

        GOTO_IF(!writeDir, PHYSFS_ERR_NO_WRITE_DIR, doOpenWriteEnd);

        h = writeDir;
        GOTO_IF_ERRPASS(!verifyPath(h, &fname, 0), doOpenWriteEnd);

        f = h->funcs;
        if (appending)
            io = f->openAppend(h->opaque, fname);
        else
            io = f->openWrite(h->opaque, fname);

        GOTO_IF_ERRPASS(!io, doOpenWriteEnd);

        fh = (FileHandle *) allocator.Malloc(sizeof (FileHandle));
        if (fh == NULL)
        {
            io->destroy(io);
            GOTO(PHYSFS_ERR_OUT_OF_MEMORY, doOpenWriteEnd);
        } /* if */
        else
        {
            memset(fh, '\0', sizeof (FileHandle));
            fh->io = io;
            fh->dirHandle = h;
            fh->next = openWriteList;
            openWriteList = fh;
        } /* else */

        doOpenWriteEnd:
        __PHYSFS_platformReleaseMutex(stateLock);
    } /* if */

    __PHYSFS_smallFree(fname);
    return ((PHYSFS_File *) fh);
}